

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O3

int lws_return_http_status(lws *wsi,uint code,char *html_body)

{
  uchar *puVar1;
  uchar *loc;
  int iVar2;
  uint uVar3;
  int iVar4;
  lws_context *plVar5;
  size_t sVar6;
  char *pcVar7;
  uchar *buf;
  uchar *puVar8;
  uchar *p;
  char slen [20];
  uchar *local_60;
  uchar *local_58;
  uchar *local_50;
  uchar local_48 [24];
  
  plVar5 = lws_get_context(wsi);
  puVar8 = plVar5->pt[wsi->tsi].serv_buf;
  local_60 = puVar8 + 0x10;
  if (wsi->vhost == (lws_vhost *)0x0) {
    _lws_log(1,"%s: wsi not bound to vhost\n","lws_return_http_status");
  }
  else {
    local_58 = (uchar *)(ulong)plVar5->pt_serv_buf_size;
    puVar1 = puVar8 + (long)local_58;
    buf = local_60;
    if (((wsi->field_0x2e0 & 2) == 0) &&
       (loc = (uchar *)(wsi->vhost->http).error_document_404, code == 0x194 && loc != (uchar *)0x0))
    {
      local_50 = local_60;
      sVar6 = strlen((char *)loc);
      iVar2 = lws_http_redirect(wsi,0x12e,loc,(int)sVar6,&local_60,puVar1);
      buf = local_50;
      if (0 < iVar2) {
        return 0;
      }
    }
    pcVar7 = "";
    if (html_body != (char *)0x0) {
      pcVar7 = html_body;
    }
    local_60 = buf;
    iVar2 = lws_add_http_header_status(wsi,code,&local_60,puVar1);
    if ((iVar2 == 0) &&
       (iVar2 = lws_add_http_header_by_token
                          (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,(uchar *)"text/html",9,&local_60,puVar1),
       iVar2 == 0)) {
      puVar8 = puVar8 + ((long)local_58 - 0x1f0);
      uVar3 = lws_snprintf((char *)puVar8,0x1fe,
                           "<html><head><meta charset=utf-8 http-equiv=\"Content-Language\" content=\"en\"/><link rel=\"stylesheet\" type=\"text/css\" href=\"/error.css\"/></head><body><h1>%u</h1>%s</body></html>"
                           ,code,pcVar7);
      iVar2 = lws_snprintf((char *)local_48,0xc,"%d",(ulong)uVar3);
      iVar2 = lws_add_http_header_by_token
                        (wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH,local_48,iVar2,&local_60,puVar1);
      if (iVar2 == 0) {
        if ((wsi->role_ops != &role_ops_h2) && ((wsi->wsistate & 0xf000000) != 0x1000000)) {
          if ((long)puVar1 - (long)local_60 < 3) {
            return 1;
          }
          puVar1 = local_60 + 1;
          *local_60 = '\r';
          local_60 = local_60 + 2;
          *puVar1 = '\n';
        }
        iVar2 = (int)local_60 - (int)buf;
        local_58 = puVar8;
        if ((wsi->field_0x2dc & 2) == 0) {
          iVar2 = iVar2 + uVar3;
          memcpy(local_60,puVar8,(long)(int)uVar3);
          iVar4 = lws_write(wsi,buf,(long)iVar2,LWS_WRITE_HTTP);
          return (uint)(iVar4 != iVar2);
        }
        iVar2 = lws_write(wsi,buf,(long)iVar2,LWS_WRITE_HTTP_HEADERS);
        if (iVar2 != (int)local_60 - (int)buf) {
          return 1;
        }
        (wsi->http).tx_content_length = (long)(int)uVar3;
        (wsi->http).tx_content_remain = (long)(int)uVar3;
        pcVar7 = (char *)lws_realloc((void *)0x0,(long)(int)(uVar3 + 0x11),"pending status body");
        (wsi->h2).pending_status_body = pcVar7;
        if (pcVar7 == (char *)0x0) {
          return -1;
        }
        strcpy(pcVar7 + 0x10,(char *)local_58);
        lws_callback_on_writable(wsi);
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int
lws_return_http_status(struct lws *wsi, unsigned int code,
		       const char *html_body)
{
	struct lws_context *context = lws_get_context(wsi);
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	unsigned char *p = pt->serv_buf + LWS_PRE;
	unsigned char *start = p;
	unsigned char *end = p + context->pt_serv_buf_size - LWS_PRE;
	char *body = (char *)start + context->pt_serv_buf_size - 512;
	int n = 0, m = 0, len;
	char slen[20];

	if (!wsi->vhost) {
		lwsl_err("%s: wsi not bound to vhost\n", __func__);

		return 1;
	}
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (!wsi->handling_404 &&
	    wsi->vhost->http.error_document_404 &&
	    code == HTTP_STATUS_NOT_FOUND)
		/* we should do a redirect, and do the 404 there */
		if (lws_http_redirect(wsi, HTTP_STATUS_FOUND,
			       (uint8_t *)wsi->vhost->http.error_document_404,
			       (int)strlen(wsi->vhost->http.error_document_404),
			       &p, end) > 0)
			return 0;
#endif

	/* if the redirect failed, just do a simple status */
	p = start;

	if (!html_body)
		html_body = "";

	if (lws_add_http_header_status(wsi, code, &p, end))
		return 1;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
					 (unsigned char *)"text/html", 9,
					 &p, end))
		return 1;

	len = lws_snprintf(body, 510, "<html><head>"
		"<meta charset=utf-8 http-equiv=\"Content-Language\" "
			"content=\"en\"/>"
		"<link rel=\"stylesheet\" type=\"text/css\" "
			"href=\"/error.css\"/>"
		"</head><body><h1>%u</h1>%s</body></html>", code, html_body);


	n = lws_snprintf(slen, 12, "%d", len);
	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH,
					 (unsigned char *)slen, n, &p, end))
		return 1;

	if (lws_finalize_http_header(wsi, &p, end))
		return 1;

#if defined(LWS_WITH_HTTP2)
	if (wsi->mux_substream) {

		/*
		 * for HTTP/2, the headers must be sent separately, since they
		 * go out in their own frame.  That puts us in a bind that
		 * we won't always be able to get away with two lws_write()s in
		 * sequence, since the first may use up the writability due to
		 * the pipe being choked or SSL_WANT_.
		 *
		 * However we do need to send the human-readable body, and the
		 * END_STREAM.
		 *
		 * Solve it by writing the headers now...
		 */
#if defined(LWS_WITH_DETAILED_LATENCY)
		wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif
		m = lws_write(wsi, start, lws_ptr_diff(p, start),
			      LWS_WRITE_HTTP_HEADERS);
		if (m != lws_ptr_diff(p, start))
			return 1;

		/*
		 * ... but stash the body and send it as a priority next
		 * handle_POLLOUT
		 */
		wsi->http.tx_content_length = len;
		wsi->http.tx_content_remain = len;

		wsi->h2.pending_status_body = lws_malloc(len + LWS_PRE + 1,
							"pending status body");
		if (!wsi->h2.pending_status_body)
			return -1;

		strcpy(wsi->h2.pending_status_body + LWS_PRE, body);
		lws_callback_on_writable(wsi);

		return 0;
	} else
#endif
	{
		/*
		 * for http/1, we can just append the body after the finalized
		 * headers and send it all in one go.
		 */

		n = lws_ptr_diff(p, start) + len;
		memcpy(p, body, len);
		m = lws_write(wsi, start, n, LWS_WRITE_HTTP);
		if (m != n)
			return 1;
	}

	return m != n;
}